

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThermalPointComponents.test.cpp
# Opt level: O2

void verifyChunk(ThermalPointComponents *chunk)

{
  vector<double,_std::allocator<double>_> *pvVar1;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef macroName_03;
  StringRef macroName_04;
  StringRef macroName_05;
  StringRef macroName_06;
  StringRef macroName_07;
  StringRef macroName_08;
  StringRef macroName_09;
  StringRef macroName_10;
  StringRef macroName_11;
  StringRef macroName_12;
  StringRef macroName_13;
  StringRef macroName_14;
  StringRef macroName_15;
  StringRef macroName_16;
  StringRef macroName_17;
  StringRef macroName_18;
  StringRef macroName_19;
  StringRef macroName_20;
  StringRef macroName_21;
  StringRef macroName_22;
  StringRef macroName_23;
  StringRef macroName_24;
  StringRef macroName_25;
  StringRef macroName_26;
  StringRef macroName_27;
  StringRef macroName_28;
  StringRef macroName_29;
  StringRef macroName_30;
  StringRef macroName_31;
  StringRef macroName_32;
  StringRef macroName_33;
  StringRef macroName_34;
  StringRef macroName_35;
  StringRef macroName_36;
  StringRef macroName_37;
  StringRef macroName_38;
  StringRef macroName_39;
  StringRef macroName_40;
  StringRef macroName_41;
  StringRef macroName_42;
  StringRef macroName_43;
  StringRef macroName_44;
  StringRef macroName_45;
  StringRef macroName_46;
  StringRef macroName_47;
  StringRef macroName_48;
  StringRef macroName_49;
  StringRef macroName_50;
  StringRef macroName_51;
  StringRef macroName_52;
  StringRef macroName_53;
  StringRef macroName_54;
  StringRef macroName_55;
  StringRef macroName_56;
  StringRef macroName_57;
  StringRef macroName_58;
  StringRef macroName_59;
  StringRef macroName_60;
  StringRef macroName_61;
  StringRef macroName_62;
  StringRef macroName_63;
  StringRef macroName_64;
  StringRef macroName_65;
  StringRef macroName_66;
  StringRef macroName_67;
  StringRef macroName_68;
  StringRef macroName_69;
  StringRef macroName_70;
  StringRef macroName_71;
  StringRef macroName_72;
  StringRef macroName_73;
  StringRef macroName_74;
  StringRef macroName_75;
  StringRef macroName_76;
  StringRef macroName_77;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef capturedExpression_03;
  StringRef capturedExpression_04;
  StringRef capturedExpression_05;
  StringRef capturedExpression_06;
  StringRef capturedExpression_07;
  StringRef capturedExpression_08;
  StringRef capturedExpression_09;
  StringRef capturedExpression_10;
  StringRef capturedExpression_11;
  StringRef capturedExpression_12;
  StringRef capturedExpression_13;
  StringRef capturedExpression_14;
  StringRef capturedExpression_15;
  StringRef capturedExpression_16;
  StringRef capturedExpression_17;
  StringRef capturedExpression_18;
  StringRef capturedExpression_19;
  StringRef capturedExpression_20;
  StringRef capturedExpression_21;
  StringRef capturedExpression_22;
  StringRef capturedExpression_23;
  StringRef capturedExpression_24;
  StringRef capturedExpression_25;
  StringRef capturedExpression_26;
  StringRef capturedExpression_27;
  StringRef capturedExpression_28;
  StringRef capturedExpression_29;
  StringRef capturedExpression_30;
  StringRef capturedExpression_31;
  StringRef capturedExpression_32;
  StringRef capturedExpression_33;
  StringRef capturedExpression_34;
  StringRef capturedExpression_35;
  StringRef capturedExpression_36;
  StringRef capturedExpression_37;
  StringRef capturedExpression_38;
  StringRef capturedExpression_39;
  StringRef capturedExpression_40;
  StringRef capturedExpression_41;
  StringRef capturedExpression_42;
  StringRef capturedExpression_43;
  StringRef capturedExpression_44;
  StringRef capturedExpression_45;
  StringRef capturedExpression_46;
  StringRef capturedExpression_47;
  StringRef capturedExpression_48;
  StringRef capturedExpression_49;
  StringRef capturedExpression_50;
  StringRef capturedExpression_51;
  StringRef capturedExpression_52;
  StringRef capturedExpression_53;
  StringRef capturedExpression_54;
  StringRef capturedExpression_55;
  StringRef capturedExpression_56;
  StringRef capturedExpression_57;
  StringRef capturedExpression_58;
  StringRef capturedExpression_59;
  StringRef capturedExpression_60;
  StringRef capturedExpression_61;
  StringRef capturedExpression_62;
  StringRef capturedExpression_63;
  StringRef capturedExpression_64;
  StringRef capturedExpression_65;
  StringRef capturedExpression_66;
  StringRef capturedExpression_67;
  StringRef capturedExpression_68;
  StringRef capturedExpression_69;
  StringRef capturedExpression_70;
  StringRef capturedExpression_71;
  StringRef capturedExpression_72;
  StringRef capturedExpression_73;
  StringRef capturedExpression_74;
  StringRef capturedExpression_75;
  StringRef capturedExpression_76;
  StringRef capturedExpression_77;
  double local_110;
  undefined1 local_108 [8];
  undefined8 local_100;
  char *local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0 [2];
  ITransientExpression local_d0;
  double *local_c0;
  WithinRelMatcher *local_b8;
  AssertionHandler catchAssertionHandler;
  double local_68;
  vector<double,_std::allocator<double>_> *local_60;
  undefined8 local_58;
  range_reference_t<D<true>_>_conflict local_50;
  
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0x70;
  macroName.m_size = 5;
  macroName.m_start = "CHECK";
  capturedExpression.m_size = 0x14;
  capturedExpression.m_start = "false == chunk.LFC()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName,(SourceLineInfo *)local_108,capturedExpression,
             ContinueOnFailure);
  local_108 = (undefined1  [8])&PTR_streamReconstructedExpression_001c9330;
  local_100._0_3_ = 0x101;
  local_f8 = "==";
  local_f0[0]._M_allocated_capacity = 2;
  local_f0[0]._8_8_ = local_f0[0]._8_8_ & 0xffffffffffffff00;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_108);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0x71;
  macroName_00.m_size = 5;
  macroName_00.m_start = "CHECK";
  capturedExpression_00.m_size = 0x27;
  capturedExpression_00.m_start = "false == chunk.tabulatedEnergyRelease()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_00,(SourceLineInfo *)local_108,capturedExpression_00,
             ContinueOnFailure);
  local_108 = (undefined1  [8])&PTR_streamReconstructedExpression_001c9330;
  local_100._0_3_ = 0x101;
  local_f8 = "==";
  local_f0[0]._M_allocated_capacity = 2;
  local_f0[0]._8_8_ = local_f0[0]._8_8_ & 0xffffffffffffff00;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_108);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0x72;
  macroName_01.m_size = 5;
  macroName_01.m_start = "CHECK";
  capturedExpression_01.m_size = 0x11;
  capturedExpression_01.m_start = "0 == chunk.NPLY()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_01,(SourceLineInfo *)local_108,capturedExpression_01,
             ContinueOnFailure);
  local_100._0_2_ = 0x101;
  local_108 = (undefined1  [8])&PTR_streamReconstructedExpression_001c9370;
  local_100 = local_100 & 0xffffffff;
  local_f8 = "==";
  local_f0[0]._M_allocated_capacity = 2;
  local_f0[0]._8_8_ = local_f0[0]._8_8_ & 0xffffffff00000000;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_108);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0x73;
  macroName_02.m_size = 5;
  macroName_02.m_start = "CHECK";
  capturedExpression_02.m_size = 0x12;
  capturedExpression_02.m_start = "0 == chunk.order()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_02,(SourceLineInfo *)local_108,capturedExpression_02,
             ContinueOnFailure);
  local_100._0_2_ = 0x101;
  local_108 = (undefined1  [8])&PTR_streamReconstructedExpression_001c9370;
  local_100 = local_100 & 0xffffffff;
  local_f8 = "==";
  local_f0[0]._M_allocated_capacity = 2;
  local_f0[0]._8_8_ = local_f0[0]._8_8_ & 0xffffffff00000000;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_108);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0x74;
  macroName_03.m_size = 5;
  macroName_03.m_start = "CHECK";
  capturedExpression_03.m_size = 0x10;
  capturedExpression_03.m_start = "0 == chunk.NFC()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_03,(SourceLineInfo *)local_108,capturedExpression_03,
             ContinueOnFailure);
  local_100._0_2_ = 0x101;
  local_108 = (undefined1  [8])&PTR_streamReconstructedExpression_001c9370;
  local_100 = local_100 & 0xffffffff;
  local_f8 = "==";
  local_f0[0]._M_allocated_capacity = 2;
  local_f0[0]._8_8_ = local_f0[0]._8_8_ & 0xffffffff00000000;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_108);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0x75;
  macroName_04.m_size = 5;
  macroName_04.m_start = "CHECK";
  capturedExpression_04.m_size = 0x26;
  capturedExpression_04.m_start = "0 == chunk.numberTabulatedComponents()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_04,(SourceLineInfo *)local_108,capturedExpression_04,
             ContinueOnFailure);
  local_100._0_2_ = 0x101;
  local_108 = (undefined1  [8])&PTR_streamReconstructedExpression_001c9370;
  local_100 = local_100 & 0xffffffff;
  local_f8 = "==";
  local_f0[0]._M_allocated_capacity = 2;
  local_f0[0]._8_8_ = local_f0[0]._8_8_ & 0xffffffff00000000;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_108);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0x77;
  macroName_05.m_size = 10;
  macroName_05.m_start = "CHECK_THAT";
  capturedExpression_05.m_size = 0x29;
  capturedExpression_05.m_start = "1.691300e+8, WithinRel( chunk.E()[0][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_05,(SourceLineInfo *)local_108,capturedExpression_05,
             ContinueOnFailure);
  local_110 = 169130000.0;
  pvVar1 = &(chunk->super_ListRecord).data;
  local_58 = 2;
  local_60 = pvVar1;
  ranges::
  view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)_1>
              *)&local_68,0);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_110);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_110;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0x78;
  macroName_06.m_size = 10;
  macroName_06.m_start = "CHECK_THAT";
  capturedExpression_06.m_size = 0x29;
  capturedExpression_06.m_start = "4.838000e+6, WithinRel( chunk.E()[1][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_06,(SourceLineInfo *)local_108,capturedExpression_06,
             ContinueOnFailure);
  local_110 = 4838000.0;
  local_58 = 2;
  local_60 = pvVar1;
  ranges::
  view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)_1>
              *)&local_68,1);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_110);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_110;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0x79;
  macroName_07.m_size = 10;
  macroName_07.m_start = "CHECK_THAT";
  capturedExpression_07.m_size = 0x29;
  capturedExpression_07.m_start = "7.400000e+3, WithinRel( chunk.E()[2][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_07,(SourceLineInfo *)local_108,capturedExpression_07,
             ContinueOnFailure);
  local_110 = 7400.0;
  local_58 = 2;
  local_60 = pvVar1;
  ranges::
  view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)_1>
              *)&local_68,2);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_110);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_110;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0x7a;
  macroName_08.m_size = 10;
  macroName_08.m_start = "CHECK_THAT";
  capturedExpression_08.m_size = 0x29;
  capturedExpression_08.m_start = "6.600000e+6, WithinRel( chunk.E()[3][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_08,(SourceLineInfo *)local_108,capturedExpression_08,
             ContinueOnFailure);
  local_110 = 6600000.0;
  local_58 = 2;
  local_60 = pvVar1;
  ranges::
  view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)_1>
              *)&local_68,3);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_110);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_110;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0x7b;
  macroName_09.m_size = 10;
  macroName_09.m_start = "CHECK_THAT";
  capturedExpression_09.m_size = 0x29;
  capturedExpression_09.m_start = "6.330000e+6, WithinRel( chunk.E()[4][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_09,(SourceLineInfo *)local_108,capturedExpression_09,
             ContinueOnFailure);
  local_110 = 6330000.0;
  local_58 = 2;
  local_60 = pvVar1;
  ranges::
  view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)_1>
              *)&local_68,4);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_110);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_110;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0x7c;
  macroName_10.m_size = 10;
  macroName_10.m_start = "CHECK_THAT";
  capturedExpression_10.m_size = 0x29;
  capturedExpression_10.m_start = "6.500000e+6, WithinRel( chunk.E()[5][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_10,(SourceLineInfo *)local_108,capturedExpression_10,
             ContinueOnFailure);
  local_110 = 6500000.0;
  local_58 = 2;
  local_60 = pvVar1;
  ranges::
  view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)_1>
              *)&local_68,5);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_110);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_110;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0x7d;
  macroName_11.m_size = 10;
  macroName_11.m_start = "CHECK_THAT";
  capturedExpression_11.m_size = 0x29;
  capturedExpression_11.m_start = "8.750000e+6, WithinRel( chunk.E()[6][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_11,(SourceLineInfo *)local_108,capturedExpression_11,
             ContinueOnFailure);
  local_110 = 8750000.0;
  local_58 = 2;
  local_60 = pvVar1;
  ranges::
  view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)_1>
              *)&local_68,6);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_110);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_110;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0x7e;
  macroName_12.m_size = 10;
  macroName_12.m_start = "CHECK_THAT";
  capturedExpression_12.m_size = 0x29;
  capturedExpression_12.m_start = "1.934054e+8, WithinRel( chunk.E()[7][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_12,(SourceLineInfo *)local_108,capturedExpression_12,
             ContinueOnFailure);
  local_110 = 193405400.0;
  local_58 = 2;
  local_60 = pvVar1;
  ranges::
  view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)_1>
              *)&local_68,7);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_110);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_110;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0x7f;
  macroName_13.m_size = 10;
  macroName_13.m_start = "CHECK_THAT";
  capturedExpression_13.m_size = 0x29;
  capturedExpression_13.m_start = "2.021554e+8, WithinRel( chunk.E()[8][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_13,(SourceLineInfo *)local_108,capturedExpression_13,
             ContinueOnFailure);
  local_110 = 202155400.0;
  local_58 = 2;
  local_60 = pvVar1;
  ranges::
  view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)_1>
              *)&local_68,8);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_110);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_110;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0x81;
  macroName_14.m_size = 10;
  macroName_14.m_start = "CHECK_THAT";
  capturedExpression_14.m_size = 0x29;
  capturedExpression_14.m_start = "4.900000e+5, WithinRel( chunk.E()[0][1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_14,(SourceLineInfo *)local_108,capturedExpression_14,
             ContinueOnFailure);
  local_110 = 490000.0;
  local_58 = 2;
  local_60 = pvVar1;
  ranges::
  view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)_1>
              *)&local_68,0);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 8));
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_110);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_110;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0x82;
  macroName_15.m_size = 10;
  macroName_15.m_start = "CHECK_THAT";
  capturedExpression_15.m_size = 0x29;
  capturedExpression_15.m_start = "7.000000e+4, WithinRel( chunk.E()[1][1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_15,(SourceLineInfo *)local_108,capturedExpression_15,
             ContinueOnFailure);
  local_110 = 70000.0;
  local_58 = 2;
  local_60 = pvVar1;
  ranges::
  view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)_1>
              *)&local_68,1);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 8));
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_110);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_110;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0x83;
  macroName_16.m_size = 10;
  macroName_16.m_start = "CHECK_THAT";
  capturedExpression_16.m_size = 0x29;
  capturedExpression_16.m_start = "1.110000e+3, WithinRel( chunk.E()[2][1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_16,(SourceLineInfo *)local_108,capturedExpression_16,
             ContinueOnFailure);
  local_110 = 1110.0;
  local_58 = 2;
  local_60 = pvVar1;
  ranges::
  view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)_1>
              *)&local_68,2);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 8));
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_110);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_110;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0x84;
  macroName_17.m_size = 10;
  macroName_17.m_start = "CHECK_THAT";
  capturedExpression_17.m_size = 0x29;
  capturedExpression_17.m_start = "5.000000e+5, WithinRel( chunk.E()[3][1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_17,(SourceLineInfo *)local_108,capturedExpression_17,
             ContinueOnFailure);
  local_110 = 500000.0;
  local_58 = 2;
  local_60 = pvVar1;
  ranges::
  view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)_1>
              *)&local_68,3);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 8));
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_110);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_110;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0x85;
  macroName_18.m_size = 10;
  macroName_18.m_start = "CHECK_THAT";
  capturedExpression_18.m_size = 0x29;
  capturedExpression_18.m_start = "5.000000e+4, WithinRel( chunk.E()[4][1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_18,(SourceLineInfo *)local_108,capturedExpression_18,
             ContinueOnFailure);
  local_110 = 50000.0;
  local_58 = 2;
  local_60 = pvVar1;
  ranges::
  view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)_1>
              *)&local_68,4);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 8));
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_110);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_110;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0x86;
  macroName_19.m_size = 10;
  macroName_19.m_start = "CHECK_THAT";
  capturedExpression_19.m_size = 0x29;
  capturedExpression_19.m_start = "5.100000e+4, WithinRel( chunk.E()[5][1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_19,(SourceLineInfo *)local_108,capturedExpression_19,
             ContinueOnFailure);
  local_110 = 51000.0;
  local_58 = 2;
  local_60 = pvVar1;
  ranges::
  view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)_1>
              *)&local_68,5);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 8));
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_110);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_110;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0x87;
  macroName_20.m_size = 10;
  macroName_20.m_start = "CHECK_THAT";
  capturedExpression_20.m_size = 0x29;
  capturedExpression_20.m_start = "7.000000e+4, WithinRel( chunk.E()[6][1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_20,(SourceLineInfo *)local_108,capturedExpression_20,
             ContinueOnFailure);
  local_110 = 70000.0;
  local_58 = 2;
  local_60 = pvVar1;
  ranges::
  view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)_1>
              *)&local_68,6);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 8));
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_110);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_110;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0x88;
  macroName_21.m_size = 10;
  macroName_21.m_start = "CHECK_THAT";
  capturedExpression_21.m_size = 0x29;
  capturedExpression_21.m_start = "1.500000e+5, WithinRel( chunk.E()[7][1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_21,(SourceLineInfo *)local_108,capturedExpression_21,
             ContinueOnFailure);
  local_110 = 150000.0;
  local_58 = 2;
  local_60 = pvVar1;
  ranges::
  view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)_1>
              *)&local_68,7);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 8));
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_110);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_110;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0x89;
  macroName_22.m_size = 10;
  macroName_22.m_start = "CHECK_THAT";
  capturedExpression_22.m_size = 0x29;
  capturedExpression_22.m_start = "1.300000e+5, WithinRel( chunk.E()[8][1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_22,(SourceLineInfo *)local_108,capturedExpression_22,
             ContinueOnFailure);
  local_110 = 130000.0;
  local_58 = 2;
  local_60 = pvVar1;
  ranges::
  view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)_1>
              *)&local_68,8);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 8));
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_110);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_110;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0x8b;
  macroName_23.m_size = 10;
  macroName_23.m_start = "CHECK_THAT";
  capturedExpression_23.m_size = 0x35;
  capturedExpression_23.m_start = "1.691300e+8, WithinRel( chunk.energyRelease()[0][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_23,(SourceLineInfo *)local_108,capturedExpression_23,
             ContinueOnFailure);
  local_110 = 169130000.0;
  local_58 = 2;
  local_60 = pvVar1;
  ranges::
  view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)_1>
              *)&local_68,0);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_110);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_110;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0x8c;
  macroName_24.m_size = 10;
  macroName_24.m_start = "CHECK_THAT";
  capturedExpression_24.m_size = 0x35;
  capturedExpression_24.m_start = "4.838000e+6, WithinRel( chunk.energyRelease()[1][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_24,(SourceLineInfo *)local_108,capturedExpression_24,
             ContinueOnFailure);
  local_110 = 4838000.0;
  local_58 = 2;
  local_60 = pvVar1;
  ranges::
  view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)_1>
              *)&local_68,1);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_110);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_110;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0x8d;
  macroName_25.m_size = 10;
  macroName_25.m_start = "CHECK_THAT";
  capturedExpression_25.m_size = 0x35;
  capturedExpression_25.m_start = "7.400000e+3, WithinRel( chunk.energyRelease()[2][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_25,(SourceLineInfo *)local_108,capturedExpression_25,
             ContinueOnFailure);
  local_110 = 7400.0;
  local_58 = 2;
  local_60 = pvVar1;
  ranges::
  view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)_1>
              *)&local_68,2);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_110);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_110;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0x8e;
  macroName_26.m_size = 10;
  macroName_26.m_start = "CHECK_THAT";
  capturedExpression_26.m_size = 0x35;
  capturedExpression_26.m_start = "6.600000e+6, WithinRel( chunk.energyRelease()[3][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_26,(SourceLineInfo *)local_108,capturedExpression_26,
             ContinueOnFailure);
  local_110 = 6600000.0;
  local_58 = 2;
  local_60 = pvVar1;
  ranges::
  view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)_1>
              *)&local_68,3);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_110);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_110;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0x8f;
  macroName_27.m_size = 10;
  macroName_27.m_start = "CHECK_THAT";
  capturedExpression_27.m_size = 0x35;
  capturedExpression_27.m_start = "6.330000e+6, WithinRel( chunk.energyRelease()[4][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_27,(SourceLineInfo *)local_108,capturedExpression_27,
             ContinueOnFailure);
  local_110 = 6330000.0;
  local_58 = 2;
  local_60 = pvVar1;
  ranges::
  view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)_1>
              *)&local_68,4);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_110);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_110;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0x90;
  macroName_28.m_size = 10;
  macroName_28.m_start = "CHECK_THAT";
  capturedExpression_28.m_size = 0x35;
  capturedExpression_28.m_start = "6.500000e+6, WithinRel( chunk.energyRelease()[5][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_28,(SourceLineInfo *)local_108,capturedExpression_28,
             ContinueOnFailure);
  local_110 = 6500000.0;
  local_58 = 2;
  local_60 = pvVar1;
  ranges::
  view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)_1>
              *)&local_68,5);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_110);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_110;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0x91;
  macroName_29.m_size = 10;
  macroName_29.m_start = "CHECK_THAT";
  capturedExpression_29.m_size = 0x35;
  capturedExpression_29.m_start = "8.750000e+6, WithinRel( chunk.energyRelease()[6][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_29,(SourceLineInfo *)local_108,capturedExpression_29,
             ContinueOnFailure);
  local_110 = 8750000.0;
  local_58 = 2;
  local_60 = pvVar1;
  ranges::
  view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)_1>
              *)&local_68,6);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_110);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_110;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0x92;
  macroName_30.m_size = 10;
  macroName_30.m_start = "CHECK_THAT";
  capturedExpression_30.m_size = 0x35;
  capturedExpression_30.m_start = "1.934054e+8, WithinRel( chunk.energyRelease()[7][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_30,(SourceLineInfo *)local_108,capturedExpression_30,
             ContinueOnFailure);
  local_110 = 193405400.0;
  local_58 = 2;
  local_60 = pvVar1;
  ranges::
  view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)_1>
              *)&local_68,7);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_110);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_110;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0x93;
  macroName_31.m_size = 10;
  macroName_31.m_start = "CHECK_THAT";
  capturedExpression_31.m_size = 0x35;
  capturedExpression_31.m_start = "2.021554e+8, WithinRel( chunk.energyRelease()[8][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_31,(SourceLineInfo *)local_108,capturedExpression_31,
             ContinueOnFailure);
  local_110 = 202155400.0;
  local_58 = 2;
  local_60 = pvVar1;
  ranges::
  view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)_1>
              *)&local_68,8);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_110);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_110;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0x95;
  macroName_32.m_size = 10;
  macroName_32.m_start = "CHECK_THAT";
  capturedExpression_32.m_size = 0x35;
  capturedExpression_32.m_start = "4.900000e+5, WithinRel( chunk.energyRelease()[0][1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_32,(SourceLineInfo *)local_108,capturedExpression_32,
             ContinueOnFailure);
  local_110 = 490000.0;
  local_58 = 2;
  local_60 = pvVar1;
  ranges::
  view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)_1>
              *)&local_68,0);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 8));
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_110);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_110;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0x96;
  macroName_33.m_size = 10;
  macroName_33.m_start = "CHECK_THAT";
  capturedExpression_33.m_size = 0x35;
  capturedExpression_33.m_start = "7.000000e+4, WithinRel( chunk.energyRelease()[1][1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_33,(SourceLineInfo *)local_108,capturedExpression_33,
             ContinueOnFailure);
  local_110 = 70000.0;
  local_58 = 2;
  local_60 = pvVar1;
  ranges::
  view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)_1>
              *)&local_68,1);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 8));
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_110);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_110;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0x97;
  macroName_34.m_size = 10;
  macroName_34.m_start = "CHECK_THAT";
  capturedExpression_34.m_size = 0x35;
  capturedExpression_34.m_start = "1.110000e+3, WithinRel( chunk.energyRelease()[2][1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_34,(SourceLineInfo *)local_108,capturedExpression_34,
             ContinueOnFailure);
  local_110 = 1110.0;
  local_58 = 2;
  local_60 = pvVar1;
  ranges::
  view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)_1>
              *)&local_68,2);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 8));
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_110);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_110;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0x98;
  macroName_35.m_size = 10;
  macroName_35.m_start = "CHECK_THAT";
  capturedExpression_35.m_size = 0x35;
  capturedExpression_35.m_start = "5.000000e+5, WithinRel( chunk.energyRelease()[3][1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_35,(SourceLineInfo *)local_108,capturedExpression_35,
             ContinueOnFailure);
  local_110 = 500000.0;
  local_58 = 2;
  local_60 = pvVar1;
  ranges::
  view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)_1>
              *)&local_68,3);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 8));
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_110);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_110;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0x99;
  macroName_36.m_size = 10;
  macroName_36.m_start = "CHECK_THAT";
  capturedExpression_36.m_size = 0x35;
  capturedExpression_36.m_start = "5.000000e+4, WithinRel( chunk.energyRelease()[4][1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_36,(SourceLineInfo *)local_108,capturedExpression_36,
             ContinueOnFailure);
  local_110 = 50000.0;
  local_58 = 2;
  local_60 = pvVar1;
  ranges::
  view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)_1>
              *)&local_68,4);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 8));
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_110);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_110;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0x9a;
  macroName_37.m_size = 10;
  macroName_37.m_start = "CHECK_THAT";
  capturedExpression_37.m_size = 0x35;
  capturedExpression_37.m_start = "5.100000e+4, WithinRel( chunk.energyRelease()[5][1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_37,(SourceLineInfo *)local_108,capturedExpression_37,
             ContinueOnFailure);
  local_110 = 51000.0;
  local_58 = 2;
  local_60 = pvVar1;
  ranges::
  view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)_1>
              *)&local_68,5);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 8));
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_110);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_110;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0x9b;
  macroName_38.m_size = 10;
  macroName_38.m_start = "CHECK_THAT";
  capturedExpression_38.m_size = 0x35;
  capturedExpression_38.m_start = "7.000000e+4, WithinRel( chunk.energyRelease()[6][1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_38,(SourceLineInfo *)local_108,capturedExpression_38,
             ContinueOnFailure);
  local_110 = 70000.0;
  local_58 = 2;
  local_60 = pvVar1;
  ranges::
  view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)_1>
              *)&local_68,6);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 8));
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_110);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_110;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0x9c;
  macroName_39.m_size = 10;
  macroName_39.m_start = "CHECK_THAT";
  capturedExpression_39.m_size = 0x35;
  capturedExpression_39.m_start = "1.500000e+5, WithinRel( chunk.energyRelease()[7][1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_39,(SourceLineInfo *)local_108,capturedExpression_39,
             ContinueOnFailure);
  local_110 = 150000.0;
  local_58 = 2;
  local_60 = pvVar1;
  ranges::
  view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)_1>
              *)&local_68,7);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 8));
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_110);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_110;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0x9d;
  macroName_40.m_size = 10;
  macroName_40.m_start = "CHECK_THAT";
  capturedExpression_40.m_size = 0x35;
  capturedExpression_40.m_start = "1.300000e+5, WithinRel( chunk.energyRelease()[8][1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_40,(SourceLineInfo *)local_108,capturedExpression_40,
             ContinueOnFailure);
  local_110 = 130000.0;
  local_58 = 2;
  local_60 = pvVar1;
  ranges::
  view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            (&local_50,
             (view_interface<ranges::chunk_view_<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>,_true>,_(ranges::cardinality)_1>
              *)&local_68,8);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 8));
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_110);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_110;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0x9f;
  macroName_41.m_size = 10;
  macroName_41.m_start = "CHECK_THAT";
  capturedExpression_41.m_size = 0x28;
  capturedExpression_41.m_start = "1.691300e+8, WithinRel( chunk.EFR()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_41,(SourceLineInfo *)local_108,capturedExpression_41,
             ContinueOnFailure);
  local_68 = 169130000.0;
  njoy::ENDFtk::section::Type<1,_458>::ThermalPointComponents::EFR(&local_50,chunk);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_68);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_68;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0xa0;
  macroName_42.m_size = 10;
  macroName_42.m_start = "CHECK_THAT";
  capturedExpression_42.m_size = 0x28;
  capturedExpression_42.m_start = "4.838000e+6, WithinRel( chunk.ENP()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_42,(SourceLineInfo *)local_108,capturedExpression_42,
             ContinueOnFailure);
  local_68 = 4838000.0;
  njoy::ENDFtk::section::Type<1,_458>::ThermalPointComponents::ENP(&local_50,chunk);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_68);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_68;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0xa1;
  macroName_43.m_size = 10;
  macroName_43.m_start = "CHECK_THAT";
  capturedExpression_43.m_size = 0x28;
  capturedExpression_43.m_start = "7.400000e+3, WithinRel( chunk.END()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_43,(SourceLineInfo *)local_108,capturedExpression_43,
             ContinueOnFailure);
  local_68 = 7400.0;
  njoy::ENDFtk::section::Type<1,_458>::ThermalPointComponents::END(&local_50,chunk);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_68);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_68;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0xa2;
  macroName_44.m_size = 10;
  macroName_44.m_start = "CHECK_THAT";
  capturedExpression_44.m_size = 0x28;
  capturedExpression_44.m_start = "6.600000e+6, WithinRel( chunk.EGP()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_44,(SourceLineInfo *)local_108,capturedExpression_44,
             ContinueOnFailure);
  local_68 = 6600000.0;
  njoy::ENDFtk::section::Type<1,_458>::ThermalPointComponents::EGP(&local_50,chunk);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_68);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_68;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0xa3;
  macroName_45.m_size = 10;
  macroName_45.m_start = "CHECK_THAT";
  capturedExpression_45.m_size = 0x28;
  capturedExpression_45.m_start = "6.330000e+6, WithinRel( chunk.EGD()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_45,(SourceLineInfo *)local_108,capturedExpression_45,
             ContinueOnFailure);
  local_68 = 6330000.0;
  njoy::ENDFtk::section::Type<1,_458>::ThermalPointComponents::EGD(&local_50,chunk);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_68);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_68;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0xa4;
  macroName_46.m_size = 10;
  macroName_46.m_start = "CHECK_THAT";
  capturedExpression_46.m_size = 0x27;
  capturedExpression_46.m_start = "6.500000e+6, WithinRel( chunk.EB()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_46,(SourceLineInfo *)local_108,capturedExpression_46,
             ContinueOnFailure);
  local_68 = 6500000.0;
  njoy::ENDFtk::section::Type<1,_458>::ThermalPointComponents::EB(&local_50,chunk);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_68);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_68;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0xa5;
  macroName_47.m_size = 10;
  macroName_47.m_start = "CHECK_THAT";
  capturedExpression_47.m_size = 0x28;
  capturedExpression_47.m_start = "8.750000e+6, WithinRel( chunk.ENU()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_47,(SourceLineInfo *)local_108,capturedExpression_47,
             ContinueOnFailure);
  local_68 = 8750000.0;
  njoy::ENDFtk::section::Type<1,_458>::ThermalPointComponents::ENU(&local_50,chunk);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_68);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_68;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0xa6;
  macroName_48.m_size = 10;
  macroName_48.m_start = "CHECK_THAT";
  capturedExpression_48.m_size = 0x27;
  capturedExpression_48.m_start = "1.934054e+8, WithinRel( chunk.ER()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_48,(SourceLineInfo *)local_108,capturedExpression_48,
             ContinueOnFailure);
  local_68 = 193405400.0;
  njoy::ENDFtk::section::Type<1,_458>::ThermalPointComponents::ER(&local_50,chunk);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_68);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_68;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0xa7;
  macroName_49.m_size = 10;
  macroName_49.m_start = "CHECK_THAT";
  capturedExpression_49.m_size = 0x27;
  capturedExpression_49.m_start = "2.021554e+8, WithinRel( chunk.ET()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_49,(SourceLineInfo *)local_108,capturedExpression_49,
             ContinueOnFailure);
  local_68 = 202155400.0;
  njoy::ENDFtk::section::Type<1,_458>::ThermalPointComponents::ET(&local_50,chunk);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_68);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_68;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0xa9;
  macroName_50.m_size = 10;
  macroName_50.m_start = "CHECK_THAT";
  capturedExpression_50.m_size = 0x28;
  capturedExpression_50.m_start = "4.900000e+5, WithinRel( chunk.EFR()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_50,(SourceLineInfo *)local_108,capturedExpression_50,
             ContinueOnFailure);
  local_68 = 490000.0;
  njoy::ENDFtk::section::Type<1,_458>::ThermalPointComponents::EFR(&local_50,chunk);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 8));
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_68);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_68;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0xaa;
  macroName_51.m_size = 10;
  macroName_51.m_start = "CHECK_THAT";
  capturedExpression_51.m_size = 0x28;
  capturedExpression_51.m_start = "7.000000e+4, WithinRel( chunk.ENP()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_51,(SourceLineInfo *)local_108,capturedExpression_51,
             ContinueOnFailure);
  local_68 = 70000.0;
  njoy::ENDFtk::section::Type<1,_458>::ThermalPointComponents::ENP(&local_50,chunk);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 8));
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_68);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_68;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0xab;
  macroName_52.m_size = 10;
  macroName_52.m_start = "CHECK_THAT";
  capturedExpression_52.m_size = 0x28;
  capturedExpression_52.m_start = "1.110000e+3, WithinRel( chunk.END()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_52,(SourceLineInfo *)local_108,capturedExpression_52,
             ContinueOnFailure);
  local_68 = 1110.0;
  njoy::ENDFtk::section::Type<1,_458>::ThermalPointComponents::END(&local_50,chunk);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 8));
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_68);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_68;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0xac;
  macroName_53.m_size = 10;
  macroName_53.m_start = "CHECK_THAT";
  capturedExpression_53.m_size = 0x28;
  capturedExpression_53.m_start = "5.000000e+5, WithinRel( chunk.EGP()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_53,(SourceLineInfo *)local_108,capturedExpression_53,
             ContinueOnFailure);
  local_68 = 500000.0;
  njoy::ENDFtk::section::Type<1,_458>::ThermalPointComponents::EGP(&local_50,chunk);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 8));
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_68);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_68;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0xad;
  macroName_54.m_size = 10;
  macroName_54.m_start = "CHECK_THAT";
  capturedExpression_54.m_size = 0x28;
  capturedExpression_54.m_start = "5.000000e+4, WithinRel( chunk.EGD()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_54,(SourceLineInfo *)local_108,capturedExpression_54,
             ContinueOnFailure);
  local_68 = 50000.0;
  njoy::ENDFtk::section::Type<1,_458>::ThermalPointComponents::EGD(&local_50,chunk);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 8));
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_68);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_68;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0xae;
  macroName_55.m_size = 10;
  macroName_55.m_start = "CHECK_THAT";
  capturedExpression_55.m_size = 0x27;
  capturedExpression_55.m_start = "5.100000e+4, WithinRel( chunk.EB()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_55,(SourceLineInfo *)local_108,capturedExpression_55,
             ContinueOnFailure);
  local_68 = 51000.0;
  njoy::ENDFtk::section::Type<1,_458>::ThermalPointComponents::EB(&local_50,chunk);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 8));
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_68);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_68;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0xaf;
  macroName_56.m_size = 10;
  macroName_56.m_start = "CHECK_THAT";
  capturedExpression_56.m_size = 0x28;
  capturedExpression_56.m_start = "7.000000e+4, WithinRel( chunk.ENU()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_56,(SourceLineInfo *)local_108,capturedExpression_56,
             ContinueOnFailure);
  local_68 = 70000.0;
  njoy::ENDFtk::section::Type<1,_458>::ThermalPointComponents::ENU(&local_50,chunk);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 8));
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_68);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_68;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0xb0;
  macroName_57.m_size = 10;
  macroName_57.m_start = "CHECK_THAT";
  capturedExpression_57.m_size = 0x27;
  capturedExpression_57.m_start = "1.500000e+5, WithinRel( chunk.ER()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_57,(SourceLineInfo *)local_108,capturedExpression_57,
             ContinueOnFailure);
  local_68 = 150000.0;
  njoy::ENDFtk::section::Type<1,_458>::ThermalPointComponents::ER(&local_50,chunk);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 8));
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_68);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_68;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0xb1;
  macroName_58.m_size = 10;
  macroName_58.m_start = "CHECK_THAT";
  capturedExpression_58.m_size = 0x27;
  capturedExpression_58.m_start = "1.300000e+5, WithinRel( chunk.ET()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_58,(SourceLineInfo *)local_108,capturedExpression_58,
             ContinueOnFailure);
  local_68 = 130000.0;
  njoy::ENDFtk::section::Type<1,_458>::ThermalPointComponents::ET(&local_50,chunk);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 8));
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_68);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_68;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0xb3;
  macroName_59.m_size = 10;
  macroName_59.m_start = "CHECK_THAT";
  capturedExpression_59.m_size = 0x35;
  capturedExpression_59.m_start = "1.691300e+8, WithinRel( chunk.fissionFragments()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_59,(SourceLineInfo *)local_108,capturedExpression_59,
             ContinueOnFailure);
  local_68 = 169130000.0;
  njoy::ENDFtk::section::Type<1,_458>::ThermalPointComponents::EFR(&local_50,chunk);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_68);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_68;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0xb4;
  macroName_60.m_size = 10;
  macroName_60.m_start = "CHECK_THAT";
  capturedExpression_60.m_size = 0x33;
  capturedExpression_60.m_start = "4.838000e+6, WithinRel( chunk.promptNeutrons()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_60,(SourceLineInfo *)local_108,capturedExpression_60,
             ContinueOnFailure);
  local_68 = 4838000.0;
  njoy::ENDFtk::section::Type<1,_458>::ThermalPointComponents::ENP(&local_50,chunk);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_68);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_68;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0xb5;
  macroName_61.m_size = 10;
  macroName_61.m_start = "CHECK_THAT";
  capturedExpression_61.m_size = 0x34;
  capturedExpression_61.m_start = "7.400000e+3, WithinRel( chunk.delayedNeutrons()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_61,(SourceLineInfo *)local_108,capturedExpression_61,
             ContinueOnFailure);
  local_68 = 7400.0;
  njoy::ENDFtk::section::Type<1,_458>::ThermalPointComponents::END(&local_50,chunk);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_68);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_68;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0xb6;
  macroName_62.m_size = 10;
  macroName_62.m_start = "CHECK_THAT";
  capturedExpression_62.m_size = 0x31;
  capturedExpression_62.m_start = "6.600000e+6, WithinRel( chunk.promptGammas()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_62,(SourceLineInfo *)local_108,capturedExpression_62,
             ContinueOnFailure);
  local_68 = 6600000.0;
  njoy::ENDFtk::section::Type<1,_458>::ThermalPointComponents::EGP(&local_50,chunk);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_68);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_68;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0xb7;
  macroName_63.m_size = 10;
  macroName_63.m_start = "CHECK_THAT";
  capturedExpression_63.m_size = 0x32;
  capturedExpression_63.m_start = "6.330000e+6, WithinRel( chunk.delayedGammas()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_63,(SourceLineInfo *)local_108,capturedExpression_63,
             ContinueOnFailure);
  local_68 = 6330000.0;
  njoy::ENDFtk::section::Type<1,_458>::ThermalPointComponents::EGD(&local_50,chunk);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_68);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_68;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0xb8;
  macroName_64.m_size = 10;
  macroName_64.m_start = "CHECK_THAT";
  capturedExpression_64.m_size = 0x31;
  capturedExpression_64.m_start = "6.500000e+6, WithinRel( chunk.delayedBetas()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_64,(SourceLineInfo *)local_108,capturedExpression_64,
             ContinueOnFailure);
  local_68 = 6500000.0;
  njoy::ENDFtk::section::Type<1,_458>::ThermalPointComponents::EB(&local_50,chunk);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_68);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_68;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0xb9;
  macroName_65.m_size = 10;
  macroName_65.m_start = "CHECK_THAT";
  capturedExpression_65.m_size = 0x2e;
  capturedExpression_65.m_start = "8.750000e+6, WithinRel( chunk.neutrinos()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_65,(SourceLineInfo *)local_108,capturedExpression_65,
             ContinueOnFailure);
  local_68 = 8750000.0;
  njoy::ENDFtk::section::Type<1,_458>::ThermalPointComponents::ENU(&local_50,chunk);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_68);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_68;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0xba;
  macroName_66.m_size = 10;
  macroName_66.m_start = "CHECK_THAT";
  capturedExpression_66.m_size = 0x38;
  capturedExpression_66.m_start = "1.934054e+8, WithinRel( chunk.totalMinusNeutrinos()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_66,(SourceLineInfo *)local_108,capturedExpression_66,
             ContinueOnFailure);
  local_68 = 193405400.0;
  njoy::ENDFtk::section::Type<1,_458>::ThermalPointComponents::ER(&local_50,chunk);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_68);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_68;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0xbb;
  macroName_67.m_size = 10;
  macroName_67.m_start = "CHECK_THAT";
  capturedExpression_67.m_size = 0x2a;
  capturedExpression_67.m_start = "2.021554e+8, WithinRel( chunk.total()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_67,(SourceLineInfo *)local_108,capturedExpression_67,
             ContinueOnFailure);
  local_68 = 202155400.0;
  njoy::ENDFtk::section::Type<1,_458>::ThermalPointComponents::ET(&local_50,chunk);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              local_50.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_68);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_68;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0xbd;
  macroName_68.m_size = 10;
  macroName_68.m_start = "CHECK_THAT";
  capturedExpression_68.m_size = 0x35;
  capturedExpression_68.m_start = "4.900000e+5, WithinRel( chunk.fissionFragments()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_68,(SourceLineInfo *)local_108,capturedExpression_68,
             ContinueOnFailure);
  local_68 = 490000.0;
  njoy::ENDFtk::section::Type<1,_458>::ThermalPointComponents::EFR(&local_50,chunk);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 8));
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_68);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_68;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0xbe;
  macroName_69.m_size = 10;
  macroName_69.m_start = "CHECK_THAT";
  capturedExpression_69.m_size = 0x33;
  capturedExpression_69.m_start = "7.000000e+4, WithinRel( chunk.promptNeutrons()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_69,(SourceLineInfo *)local_108,capturedExpression_69,
             ContinueOnFailure);
  local_68 = 70000.0;
  njoy::ENDFtk::section::Type<1,_458>::ThermalPointComponents::ENP(&local_50,chunk);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 8));
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_68);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_68;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0xbf;
  macroName_70.m_size = 10;
  macroName_70.m_start = "CHECK_THAT";
  capturedExpression_70.m_size = 0x34;
  capturedExpression_70.m_start = "1.110000e+3, WithinRel( chunk.delayedNeutrons()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_70,(SourceLineInfo *)local_108,capturedExpression_70,
             ContinueOnFailure);
  local_68 = 1110.0;
  njoy::ENDFtk::section::Type<1,_458>::ThermalPointComponents::END(&local_50,chunk);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 8));
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_68);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_68;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0xc0;
  macroName_71.m_size = 10;
  macroName_71.m_start = "CHECK_THAT";
  capturedExpression_71.m_size = 0x31;
  capturedExpression_71.m_start = "5.000000e+5, WithinRel( chunk.promptGammas()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_71,(SourceLineInfo *)local_108,capturedExpression_71,
             ContinueOnFailure);
  local_68 = 500000.0;
  njoy::ENDFtk::section::Type<1,_458>::ThermalPointComponents::EGP(&local_50,chunk);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 8));
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_68);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_68;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0xc1;
  macroName_72.m_size = 10;
  macroName_72.m_start = "CHECK_THAT";
  capturedExpression_72.m_size = 0x32;
  capturedExpression_72.m_start = "5.000000e+4, WithinRel( chunk.delayedGammas()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_72,(SourceLineInfo *)local_108,capturedExpression_72,
             ContinueOnFailure);
  local_68 = 50000.0;
  njoy::ENDFtk::section::Type<1,_458>::ThermalPointComponents::EGD(&local_50,chunk);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 8));
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_68);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_68;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0xc2;
  macroName_73.m_size = 10;
  macroName_73.m_start = "CHECK_THAT";
  capturedExpression_73.m_size = 0x31;
  capturedExpression_73.m_start = "5.100000e+4, WithinRel( chunk.delayedBetas()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_73,(SourceLineInfo *)local_108,capturedExpression_73,
             ContinueOnFailure);
  local_68 = 51000.0;
  njoy::ENDFtk::section::Type<1,_458>::ThermalPointComponents::EB(&local_50,chunk);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 8));
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_68);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_68;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0xc3;
  macroName_74.m_size = 10;
  macroName_74.m_start = "CHECK_THAT";
  capturedExpression_74.m_size = 0x2e;
  capturedExpression_74.m_start = "7.000000e+4, WithinRel( chunk.neutrinos()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_74,(SourceLineInfo *)local_108,capturedExpression_74,
             ContinueOnFailure);
  local_68 = 70000.0;
  njoy::ENDFtk::section::Type<1,_458>::ThermalPointComponents::ENU(&local_50,chunk);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 8));
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_68);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_68;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0xc4;
  macroName_75.m_size = 10;
  macroName_75.m_start = "CHECK_THAT";
  capturedExpression_75.m_size = 0x38;
  capturedExpression_75.m_start = "1.500000e+5, WithinRel( chunk.totalMinusNeutrinos()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_75,(SourceLineInfo *)local_108,capturedExpression_75,
             ContinueOnFailure);
  local_68 = 150000.0;
  njoy::ENDFtk::section::Type<1,_458>::ThermalPointComponents::ER(&local_50,chunk);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 8));
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_68);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_68;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0xc5;
  macroName_76.m_size = 10;
  macroName_76.m_start = "CHECK_THAT";
  capturedExpression_76.m_size = 0x2a;
  capturedExpression_76.m_start = "1.300000e+5, WithinRel( chunk.total()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_76,(SourceLineInfo *)local_108,capturedExpression_76,
             ContinueOnFailure);
  local_68 = 130000.0;
  njoy::ENDFtk::section::Type<1,_458>::ThermalPointComponents::ET(&local_50,chunk);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_108,
             *(double *)
              ((long)local_50.base_.data_.
                     super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
                     .
                     super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
                     ._M_head_impl._M_current + 8));
  local_d0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_108,&local_68);
  local_d0.m_isBinaryExpression = true;
  local_d0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c93b0;
  local_c0 = &local_68;
  local_b8 = (WithinRelMatcher *)local_108;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0);
  Catch::ITransientExpression::~ITransientExpression(&local_d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_108 = (undefined1  [8])0x17e4ec;
  local_100 = (pointer)0xc7;
  macroName_77.m_size = 5;
  macroName_77.m_start = "CHECK";
  capturedExpression_77.m_size = 0xf;
  capturedExpression_77.m_start = "4 == chunk.NC()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_77,(SourceLineInfo *)local_108,capturedExpression_77,
             ContinueOnFailure);
  local_f0[0]._8_8_ =
       (((long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start >> 3) + 5) / 6 + 1;
  local_100._1_1_ = local_f0[0]._8_8_ == 4;
  local_100._0_1_ = true;
  local_108 = (undefined1  [8])&PTR_streamReconstructedExpression_001c93f0;
  local_100._4_4_ = 4;
  local_f8 = "==";
  local_f0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_108);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_108);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  return;
}

Assistant:

void verifyChunk( const ThermalPointComponents& chunk ) {

  CHECK( false == chunk.LFC() );
  CHECK( false == chunk.tabulatedEnergyRelease() );
  CHECK( 0 == chunk.NPLY() );
  CHECK( 0 == chunk.order() );
  CHECK( 0 == chunk.NFC() );
  CHECK( 0 == chunk.numberTabulatedComponents() );

  CHECK_THAT( 1.691300e+8, WithinRel( chunk.E()[0][0] ) );
  CHECK_THAT( 4.838000e+6, WithinRel( chunk.E()[1][0] ) );
  CHECK_THAT( 7.400000e+3, WithinRel( chunk.E()[2][0] ) );
  CHECK_THAT( 6.600000e+6, WithinRel( chunk.E()[3][0] ) );
  CHECK_THAT( 6.330000e+6, WithinRel( chunk.E()[4][0] ) );
  CHECK_THAT( 6.500000e+6, WithinRel( chunk.E()[5][0] ) );
  CHECK_THAT( 8.750000e+6, WithinRel( chunk.E()[6][0] ) );
  CHECK_THAT( 1.934054e+8, WithinRel( chunk.E()[7][0] ) );
  CHECK_THAT( 2.021554e+8, WithinRel( chunk.E()[8][0] ) );

  CHECK_THAT( 4.900000e+5, WithinRel( chunk.E()[0][1] ) );
  CHECK_THAT( 7.000000e+4, WithinRel( chunk.E()[1][1] ) );
  CHECK_THAT( 1.110000e+3, WithinRel( chunk.E()[2][1] ) );
  CHECK_THAT( 5.000000e+5, WithinRel( chunk.E()[3][1] ) );
  CHECK_THAT( 5.000000e+4, WithinRel( chunk.E()[4][1] ) );
  CHECK_THAT( 5.100000e+4, WithinRel( chunk.E()[5][1] ) );
  CHECK_THAT( 7.000000e+4, WithinRel( chunk.E()[6][1] ) );
  CHECK_THAT( 1.500000e+5, WithinRel( chunk.E()[7][1] ) );
  CHECK_THAT( 1.300000e+5, WithinRel( chunk.E()[8][1] ) );

  CHECK_THAT( 1.691300e+8, WithinRel( chunk.energyRelease()[0][0] ) );
  CHECK_THAT( 4.838000e+6, WithinRel( chunk.energyRelease()[1][0] ) );
  CHECK_THAT( 7.400000e+3, WithinRel( chunk.energyRelease()[2][0] ) );
  CHECK_THAT( 6.600000e+6, WithinRel( chunk.energyRelease()[3][0] ) );
  CHECK_THAT( 6.330000e+6, WithinRel( chunk.energyRelease()[4][0] ) );
  CHECK_THAT( 6.500000e+6, WithinRel( chunk.energyRelease()[5][0] ) );
  CHECK_THAT( 8.750000e+6, WithinRel( chunk.energyRelease()[6][0] ) );
  CHECK_THAT( 1.934054e+8, WithinRel( chunk.energyRelease()[7][0] ) );
  CHECK_THAT( 2.021554e+8, WithinRel( chunk.energyRelease()[8][0] ) );

  CHECK_THAT( 4.900000e+5, WithinRel( chunk.energyRelease()[0][1] ) );
  CHECK_THAT( 7.000000e+4, WithinRel( chunk.energyRelease()[1][1] ) );
  CHECK_THAT( 1.110000e+3, WithinRel( chunk.energyRelease()[2][1] ) );
  CHECK_THAT( 5.000000e+5, WithinRel( chunk.energyRelease()[3][1] ) );
  CHECK_THAT( 5.000000e+4, WithinRel( chunk.energyRelease()[4][1] ) );
  CHECK_THAT( 5.100000e+4, WithinRel( chunk.energyRelease()[5][1] ) );
  CHECK_THAT( 7.000000e+4, WithinRel( chunk.energyRelease()[6][1] ) );
  CHECK_THAT( 1.500000e+5, WithinRel( chunk.energyRelease()[7][1] ) );
  CHECK_THAT( 1.300000e+5, WithinRel( chunk.energyRelease()[8][1] ) );

  CHECK_THAT( 1.691300e+8, WithinRel( chunk.EFR()[0] ) );
  CHECK_THAT( 4.838000e+6, WithinRel( chunk.ENP()[0] ) );
  CHECK_THAT( 7.400000e+3, WithinRel( chunk.END()[0] ) );
  CHECK_THAT( 6.600000e+6, WithinRel( chunk.EGP()[0] ) );
  CHECK_THAT( 6.330000e+6, WithinRel( chunk.EGD()[0] ) );
  CHECK_THAT( 6.500000e+6, WithinRel( chunk.EB()[0] ) );
  CHECK_THAT( 8.750000e+6, WithinRel( chunk.ENU()[0] ) );
  CHECK_THAT( 1.934054e+8, WithinRel( chunk.ER()[0] ) );
  CHECK_THAT( 2.021554e+8, WithinRel( chunk.ET()[0] ) );

  CHECK_THAT( 4.900000e+5, WithinRel( chunk.EFR()[1] ) );
  CHECK_THAT( 7.000000e+4, WithinRel( chunk.ENP()[1] ) );
  CHECK_THAT( 1.110000e+3, WithinRel( chunk.END()[1] ) );
  CHECK_THAT( 5.000000e+5, WithinRel( chunk.EGP()[1] ) );
  CHECK_THAT( 5.000000e+4, WithinRel( chunk.EGD()[1] ) );
  CHECK_THAT( 5.100000e+4, WithinRel( chunk.EB()[1] ) );
  CHECK_THAT( 7.000000e+4, WithinRel( chunk.ENU()[1] ) );
  CHECK_THAT( 1.500000e+5, WithinRel( chunk.ER()[1] ) );
  CHECK_THAT( 1.300000e+5, WithinRel( chunk.ET()[1] ) );

  CHECK_THAT( 1.691300e+8, WithinRel( chunk.fissionFragments()[0] ) );
  CHECK_THAT( 4.838000e+6, WithinRel( chunk.promptNeutrons()[0] ) );
  CHECK_THAT( 7.400000e+3, WithinRel( chunk.delayedNeutrons()[0] ) );
  CHECK_THAT( 6.600000e+6, WithinRel( chunk.promptGammas()[0] ) );
  CHECK_THAT( 6.330000e+6, WithinRel( chunk.delayedGammas()[0] ) );
  CHECK_THAT( 6.500000e+6, WithinRel( chunk.delayedBetas()[0] ) );
  CHECK_THAT( 8.750000e+6, WithinRel( chunk.neutrinos()[0] ) );
  CHECK_THAT( 1.934054e+8, WithinRel( chunk.totalMinusNeutrinos()[0] ) );
  CHECK_THAT( 2.021554e+8, WithinRel( chunk.total()[0] ) );

  CHECK_THAT( 4.900000e+5, WithinRel( chunk.fissionFragments()[1] ) );
  CHECK_THAT( 7.000000e+4, WithinRel( chunk.promptNeutrons()[1] ) );
  CHECK_THAT( 1.110000e+3, WithinRel( chunk.delayedNeutrons()[1] ) );
  CHECK_THAT( 5.000000e+5, WithinRel( chunk.promptGammas()[1] ) );
  CHECK_THAT( 5.000000e+4, WithinRel( chunk.delayedGammas()[1] ) );
  CHECK_THAT( 5.100000e+4, WithinRel( chunk.delayedBetas()[1] ) );
  CHECK_THAT( 7.000000e+4, WithinRel( chunk.neutrinos()[1] ) );
  CHECK_THAT( 1.500000e+5, WithinRel( chunk.totalMinusNeutrinos()[1] ) );
  CHECK_THAT( 1.300000e+5, WithinRel( chunk.total()[1] ) );

  CHECK( 4 == chunk.NC() );
}